

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void mbedtls_ssl_free(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  char *__s;
  
  if (ssl != (mbedtls_ssl_context *)0x0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1af3,"=> free");
    puVar1 = ssl->out_buf;
    if (puVar1 != (uchar *)0x0) {
      lVar3 = 0;
      do {
        puVar1[lVar3] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x414d);
      free(ssl->out_buf);
    }
    puVar1 = ssl->in_buf;
    if (puVar1 != (uchar *)0x0) {
      lVar3 = 0;
      do {
        puVar1[lVar3] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x414d);
      free(ssl->in_buf);
    }
    if (ssl->transform != (mbedtls_ssl_transform *)0x0) {
      mbedtls_ssl_transform_free(ssl->transform);
      free(ssl->transform);
    }
    if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
      mbedtls_ssl_handshake_free(ssl->handshake);
      mbedtls_ssl_transform_free(ssl->transform_negotiate);
      mbedtls_ssl_session_free(ssl->session_negotiate);
      free(ssl->handshake);
      free(ssl->transform_negotiate);
      free(ssl->session_negotiate);
    }
    if (ssl->session != (mbedtls_ssl_session *)0x0) {
      mbedtls_ssl_session_free(ssl->session);
      free(ssl->session);
    }
    __s = ssl->hostname;
    if (__s != (char *)0x0) {
      sVar2 = strlen(__s);
      if (sVar2 != 0) {
        sVar4 = 0;
        do {
          __s[sVar4] = '\0';
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
        __s = ssl->hostname;
      }
      free(__s);
    }
    free(ssl->cli_id);
    lVar3 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1b34,"<= free");
    do {
      *(undefined1 *)((long)&ssl->conf + lVar3) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x1e8);
  }
  return;
}

Assistant:

void mbedtls_ssl_free( mbedtls_ssl_context *ssl )
{
    if( ssl == NULL )
        return;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> free" ) );

    if( ssl->out_buf != NULL )
    {
        mbedtls_zeroize( ssl->out_buf, MBEDTLS_SSL_BUFFER_LEN );
        mbedtls_free( ssl->out_buf );
    }

    if( ssl->in_buf != NULL )
    {
        mbedtls_zeroize( ssl->in_buf, MBEDTLS_SSL_BUFFER_LEN );
        mbedtls_free( ssl->in_buf );
    }

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->compress_buf != NULL )
    {
        mbedtls_zeroize( ssl->compress_buf, MBEDTLS_SSL_BUFFER_LEN );
        mbedtls_free( ssl->compress_buf );
    }
#endif

    if( ssl->transform )
    {
        mbedtls_ssl_transform_free( ssl->transform );
        mbedtls_free( ssl->transform );
    }

    if( ssl->handshake )
    {
        mbedtls_ssl_handshake_free( ssl->handshake );
        mbedtls_ssl_transform_free( ssl->transform_negotiate );
        mbedtls_ssl_session_free( ssl->session_negotiate );

        mbedtls_free( ssl->handshake );
        mbedtls_free( ssl->transform_negotiate );
        mbedtls_free( ssl->session_negotiate );
    }

    if( ssl->session )
    {
        mbedtls_ssl_session_free( ssl->session );
        mbedtls_free( ssl->session );
    }

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( ssl->hostname != NULL )
    {
        mbedtls_zeroize( ssl->hostname, strlen( ssl->hostname ) );
        mbedtls_free( ssl->hostname );
    }
#endif

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_finish != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_finish()" ) );
        mbedtls_ssl_hw_record_finish( ssl );
    }
#endif

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY) && defined(MBEDTLS_SSL_SRV_C)
    mbedtls_free( ssl->cli_id );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= free" ) );

    /* Actually clear after last debug message */
    mbedtls_zeroize( ssl, sizeof( mbedtls_ssl_context ) );
}